

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O3

int MPIABI_Igatherv(void *sendbuf,int sendcount,MPIABI_Datatype sendtype,void *recvbuf,
                   int *recvcounts,int *displs,MPIABI_Datatype recvtype,int root,MPIABI_Comm comm,
                   MPIABI_Request *request)

{
  int iVar1;
  
  iVar1 = MPI_Igatherv();
  return iVar1;
}

Assistant:

int MPIABI_Igatherv(
  const void * sendbuf,
  int sendcount,
  MPIABI_Datatype sendtype,
  void * recvbuf,
  const int * recvcounts,
  const int * displs,
  MPIABI_Datatype recvtype,
  int root,
  MPIABI_Comm comm,
  MPIABI_Request * request
) {
  return MPI_Igatherv(
    sendbuf,
    sendcount,
    (MPI_Datatype)(WPI_Datatype)sendtype,
    recvbuf,
    recvcounts,
    displs,
    (MPI_Datatype)(WPI_Datatype)recvtype,
    root,
    (MPI_Comm)(WPI_Comm)comm,
    (MPI_Request *)(WPI_RequestPtr)request
  );
}